

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.cc
# Opt level: O2

void __thiscall testing::internal::ExpectationBase::CheckActionCountIfNotDone(ExpectationBase *this)

{
  pointer ppvVar1;
  pointer ppvVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ostream *poVar7;
  char *pcVar8;
  int iVar9;
  string sStack_1d8;
  MutexLock l;
  ostream local_1a8 [376];
  
  l.mutex_ = &(this->mutex_).super_MutexBase;
  MutexBase::Lock(l.mutex_);
  if (this->action_count_checked_ == false) {
    this->action_count_checked_ = true;
    GTestMutexLock::~GTestMutexLock(&l);
    if (this->cardinality_specified_ == true) {
      ppvVar1 = (this->untyped_actions_).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      ppvVar2 = (this->untyped_actions_).
                super__Vector_base<const_void_*,_std::allocator<const_void_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      iVar5 = (*((this->cardinality_).impl_.
                 super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_CardinalityInterface[3])();
      iVar6 = (*((this->cardinality_).impl_.
                 super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr)->_vptr_CardinalityInterface[2])();
      bVar4 = true;
      iVar9 = (int)((ulong)((long)ppvVar1 - (long)ppvVar2) >> 3);
      if ((iVar9 <= iVar5) && ((iVar5 != iVar9 || (this->repeated_action_specified_ == false)))) {
        if (iVar9 < 1) {
          return;
        }
        if (iVar6 <= iVar9) {
          return;
        }
        if (this->repeated_action_specified_ != false) {
          return;
        }
        bVar4 = false;
      }
      std::__cxx11::stringstream::stringstream((stringstream *)&l);
      DescribeLocationTo(this,local_1a8);
      poVar7 = std::operator<<(local_1a8,"Too ");
      pcVar8 = "few";
      if (bVar4) {
        pcVar8 = "many";
      }
      poVar7 = std::operator<<(poVar7,pcVar8);
      poVar7 = std::operator<<(poVar7," actions specified in ");
      poVar7 = std::operator<<(poVar7,(this->source_text_)._M_dataplus._M_p);
      poVar7 = std::operator<<(poVar7,"...\n");
      std::operator<<(poVar7,"Expected to be ");
      peVar3 = (this->cardinality_).impl_.
               super___shared_ptr<const_testing::CardinalityInterface,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      (*peVar3->_vptr_CardinalityInterface[6])(peVar3,local_1a8);
      poVar7 = std::operator<<(local_1a8,", but has ");
      pcVar8 = "only ";
      if (bVar4) {
        pcVar8 = "";
      }
      poVar7 = std::operator<<(poVar7,pcVar8);
      poVar7 = (ostream *)std::ostream::operator<<(poVar7,iVar9);
      poVar7 = std::operator<<(poVar7," WillOnce()");
      pcVar8 = "  %s";
      if (iVar9 == 1) {
        pcVar8 = "\x02\x01\x01";
      }
      std::operator<<(poVar7,pcVar8 + 3);
      if (this->repeated_action_specified_ == true) {
        std::operator<<(local_1a8," and a WillRepeatedly()");
      }
      std::operator<<(local_1a8,".");
      std::__cxx11::stringbuf::str();
      Log(kWarning,&sStack_1d8,-1);
      std::__cxx11::string::~string((string *)&sStack_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&l);
    }
  }
  else {
    GTestMutexLock::~GTestMutexLock(&l);
  }
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(mutex_) {
  bool should_check = false;
  {
    MutexLock l(&mutex_);
    if (!action_count_checked_) {
      action_count_checked_ = true;
      should_check = true;
    }
  }

  if (should_check) {
    if (!cardinality_specified_) {
      // The cardinality was inferred - no need to check the action
      // count against it.
      return;
    }

    // The cardinality was explicitly specified.
    const int action_count = static_cast<int>(untyped_actions_.size());
    const int upper_bound = cardinality().ConservativeUpperBound();
    const int lower_bound = cardinality().ConservativeLowerBound();
    bool too_many;  // True if there are too many actions, or false
    // if there are too few.
    if (action_count > upper_bound ||
        (action_count == upper_bound && repeated_action_specified_)) {
      too_many = true;
    } else if (0 < action_count && action_count < lower_bound &&
               !repeated_action_specified_) {
      too_many = false;
    } else {
      return;
    }

    ::std::stringstream ss;
    DescribeLocationTo(&ss);
    ss << "Too " << (too_many ? "many" : "few") << " actions specified in "
       << source_text() << "...\n"
       << "Expected to be ";
    cardinality().DescribeTo(&ss);
    ss << ", but has " << (too_many ? "" : "only ") << action_count
       << " WillOnce()" << (action_count == 1 ? "" : "s");
    if (repeated_action_specified_) {
      ss << " and a WillRepeatedly()";
    }
    ss << ".";
    Log(kWarning, ss.str(), -1);  // -1 means "don't print stack trace".
  }
}